

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O0

database_binder * sqlite::operator<<(database_binder *db,uint *val)

{
  int inx;
  pointer stmt;
  char *in_RCX;
  str_ref sql;
  string local_50;
  undefined1 local_30 [16];
  int local_1c;
  uint *puStack_18;
  int result;
  uint *val_local;
  database_binder *db_local;
  
  puStack_18 = val;
  val_local = (uint *)db;
  stmt = std::unique_ptr<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>::get(&db->_stmt);
  inx = database_binder::_next_index((database_binder *)val_local);
  local_1c = bind_col_in_db<unsigned_int,void>(stmt,inx,puStack_18);
  if (local_1c != 0) {
    database_binder::sql_abi_cxx11_(&local_50,(database_binder *)val_local);
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sql._M_len = local_30._8_8_;
    sql._M_str = in_RCX;
    errors::throw_sqlite_error((errors *)&local_1c,local_30._0_8_,sql);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (database_binder *)val_local;
}

Assistant:

database_binder &operator<<(database_binder& db, T&& val) {
		int result = bind_col_in_db(db._stmt.get(), db._next_index(), std::forward<T>(val));
		if(result != SQLITE_OK)
			exceptions::throw_sqlite_error(result, db.sql());
		return db;
	}